

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_test_cases.cpp
# Opt level: O0

void flat_forward_list_find_by_offset_test1(void)

{
  pointer_type *this;
  size_t *psVar1;
  bool bVar2;
  size_type sVar3;
  size_t sVar4;
  size_t sVar5;
  undefined1 local_200 [8];
  undefined1 local_1f8 [8];
  iterator after_last_end;
  undefined1 local_1e8 [8];
  iterator after_last_start;
  undefined1 local_1d8 [8];
  iterator at_last_end;
  iterator at_last_start;
  iterator before_last_end;
  undefined1 local_1b8 [8];
  iterator before_last_start;
  iterator after_element2_end;
  iterator after_element2_start;
  iterator at_element2_end;
  iterator at_element2_start;
  iterator before_element2_end;
  iterator before_element2_start;
  iterator after_element1_end;
  iterator after_element1_start;
  iterator at_element1_end;
  iterator at_element1_start;
  undefined1 local_158 [8];
  iterator before_element1_end;
  iterator before_element1_start;
  const_iterator local_140;
  const_iterator local_138;
  const_iterator local_130;
  const_iterator local_128;
  const_iterator local_120;
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
  local_118 [8];
  undefined1 local_110 [8];
  range_t last_range;
  iterator last_it;
  range_t element4_range;
  flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  element4_it;
  range_t element3_range;
  flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  element3_it;
  range_t element2_range;
  flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  element2_it;
  range_t element1_range;
  flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  element1_it;
  range_t element0_range;
  const_iterator element0_it;
  allocator_type local_40;
  undefined1 local_38 [8];
  pmr_flat_forward_list<FLAT_FORWARD_LIST_TEST> ffl;
  debug_memory_resource dbg_memory_resource;
  
  this = &ffl.buffer_.v2_.end;
  iffl::debug_memory_resource::debug_memory_resource((debug_memory_resource *)this);
  std::pmr::polymorphic_allocator<char>::polymorphic_allocator(&local_40,(memory_resource *)this);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::flat_forward_list((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                       *)local_38,local_40);
  fill_container_with_data<iffl::flat_forward_list<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,std::pmr::polymorphic_allocator<char>>>
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)local_38,10);
  sVar3 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::size((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                  *)local_38);
  if (sVar3 < 10) {
    std::terminate();
  }
  psVar1 = &element0_range.super_range.buffer_end;
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::cbegin((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
            *)psVar1);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::range((range_t *)&element1_it,
          (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)local_38,(const_iterator *)psVar1);
  iffl::range::begin((range *)&element1_it);
  sVar4 = iffl::range::begin((range *)&element1_it);
  if (element0_range.super_range.data_end <= sVar4) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element1_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element0_range.super_range.buffer_end,sVar4 - 1)
  ;
  if (bVar2) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element1_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element0_range.super_range.buffer_end,sVar4);
  if (!bVar2) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element1_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element0_range.super_range.buffer_end,sVar4 + 1)
  ;
  if (!bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element0_range.super_range.buffer_end,
                     element0_range.super_range.data_end - 1);
  if (!bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element0_range.super_range.buffer_end,
                     element0_range.super_range.data_end);
  if (bVar2) {
    std::terminate();
  }
  sVar4 = iffl::range_with_alighment<8UL>::buffer_end_aligned
                    ((range_with_alighment<8UL> *)&element1_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element0_range.super_range.buffer_end,sVar4 + 1)
  ;
  if (bVar2) {
    std::terminate();
  }
  psVar1 = &element1_range.super_range.buffer_end;
  iffl::
  flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  ::operator+((flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
               *)psVar1,(int)&element0_range + 0x10);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::range((range_t *)&element2_it,
          (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)local_38,(const_iterator *)psVar1);
  iffl::range::begin((range *)&element2_it);
  sVar4 = iffl::range::begin((range *)&element2_it);
  if (element1_range.super_range.data_end <= sVar4) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element2_it);
  sVar5 = iffl::range_with_alighment<8UL>::buffer_end_aligned
                    ((range_with_alighment<8UL> *)&element1_it);
  if (sVar4 != sVar5) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element2_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element1_range.super_range.buffer_end,sVar4 - 1)
  ;
  if (bVar2) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element2_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element1_range.super_range.buffer_end,sVar4);
  if (!bVar2) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element2_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element1_range.super_range.buffer_end,sVar4 + 1)
  ;
  if (!bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element1_range.super_range.buffer_end,
                     element1_range.super_range.data_end - 1);
  if (!bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element1_range.super_range.buffer_end,
                     element1_range.super_range.data_end);
  if (bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element1_range.super_range.buffer_end,
                     element1_range.super_range.data_end + 1);
  if (bVar2) {
    std::terminate();
  }
  psVar1 = &element2_range.super_range.buffer_end;
  iffl::
  flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  ::operator+((flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
               *)psVar1,(int)&element1_range + 0x10);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::range((range_t *)&element3_it,
          (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)local_38,(const_iterator *)psVar1);
  iffl::range::begin((range *)&element3_it);
  sVar4 = iffl::range::begin((range *)&element3_it);
  if (element2_range.super_range.data_end <= sVar4) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element3_it);
  sVar5 = iffl::range_with_alighment<8UL>::buffer_end_aligned
                    ((range_with_alighment<8UL> *)&element2_it);
  if (sVar4 != sVar5) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element3_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element2_range.super_range.buffer_end,sVar4 - 1)
  ;
  if (bVar2) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element3_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element2_range.super_range.buffer_end,sVar4);
  if (!bVar2) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element3_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element2_range.super_range.buffer_end,sVar4 + 1)
  ;
  if (!bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element2_range.super_range.buffer_end,
                     element2_range.super_range.data_end - 1);
  if (!bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element2_range.super_range.buffer_end,
                     element2_range.super_range.data_end);
  if (bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element2_range.super_range.buffer_end,
                     element2_range.super_range.data_end + 1);
  if (bVar2) {
    std::terminate();
  }
  psVar1 = &element3_range.super_range.buffer_end;
  iffl::
  flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  ::operator+((flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
               *)psVar1,(int)&element2_range + 0x10);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::range((range_t *)&element4_it,
          (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)local_38,(const_iterator *)psVar1);
  iffl::range::begin((range *)&element4_it);
  sVar4 = iffl::range::begin((range *)&element4_it);
  if (element3_range.super_range.data_end <= sVar4) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element4_it);
  sVar5 = iffl::range_with_alighment<8UL>::buffer_end_aligned
                    ((range_with_alighment<8UL> *)&element3_it);
  if (sVar4 != sVar5) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element4_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element3_range.super_range.buffer_end,sVar4 - 1)
  ;
  if (bVar2) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element4_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element3_range.super_range.buffer_end,sVar4);
  if (!bVar2) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&element4_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element3_range.super_range.buffer_end,sVar4 + 1)
  ;
  if (!bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element3_range.super_range.buffer_end,
                     element3_range.super_range.data_end - 1);
  if (!bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element3_range.super_range.buffer_end,
                     element3_range.super_range.data_end);
  if (bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element3_range.super_range.buffer_end,
                     element3_range.super_range.data_end + 1);
  if (bVar2) {
    std::terminate();
  }
  psVar1 = &element4_range.super_range.buffer_end;
  iffl::
  flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  ::operator+((flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
               *)psVar1,(int)&element3_range + 0x10);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::range((range_t *)&last_it,
          (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)local_38,(const_iterator *)psVar1);
  iffl::range::begin((range *)&last_it);
  sVar4 = iffl::range::begin((range *)&last_it);
  if (element4_range.super_range.data_end <= sVar4) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&last_it);
  sVar5 = iffl::range_with_alighment<8UL>::buffer_end_aligned
                    ((range_with_alighment<8UL> *)&element4_it);
  if (sVar4 != sVar5) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&last_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element4_range.super_range.buffer_end,sVar4 - 1)
  ;
  if (bVar2) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&last_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element4_range.super_range.buffer_end,sVar4);
  if (!bVar2) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&last_it);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element4_range.super_range.buffer_end,sVar4 + 1)
  ;
  if (!bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element4_range.super_range.buffer_end,
                     element4_range.super_range.data_end - 1);
  if (!bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element4_range.super_range.buffer_end,
                     element4_range.super_range.data_end);
  if (bVar2) {
    std::terminate();
  }
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&element4_range.super_range.buffer_end,
                     element4_range.super_range.data_end + 1);
  if (bVar2) {
    std::terminate();
  }
  psVar1 = &last_range.super_range.buffer_end;
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::last((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          *)psVar1);
  iffl::
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
  ::
  flat_forward_list_iterator_t<iffl::flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>,void>
            (local_118,
             (flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              *)psVar1);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::range((range_t *)local_110,
          (flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
           *)local_38,(const_iterator *)local_118);
  iffl::range::begin((range *)local_110);
  sVar4 = iffl::range::begin((range *)local_110);
  if (last_range.super_range.data_end <= sVar4) {
    std::terminate();
  }
  sVar4 = iffl::range::begin((range *)&last_it);
  if (last_range.super_range.data_end < sVar4) {
    std::terminate();
  }
  iffl::
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
  ::
  flat_forward_list_iterator_t<iffl::flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>,void>
            ((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
              *)&local_120,
             (flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              *)&last_range.super_range.buffer_end);
  sVar4 = iffl::range::begin((range *)local_110);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,&local_120,sVar4 - 1);
  if (bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
  ::
  flat_forward_list_iterator_t<iffl::flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>,void>
            ((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
              *)&local_128,
             (flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              *)&last_range.super_range.buffer_end);
  sVar4 = iffl::range::begin((range *)local_110);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,&local_128,sVar4);
  if (!bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
  ::
  flat_forward_list_iterator_t<iffl::flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>,void>
            ((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
              *)&local_130,
             (flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              *)&last_range.super_range.buffer_end);
  sVar4 = iffl::range::begin((range *)local_110);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,&local_130,sVar4 + 1);
  if (!bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
  ::
  flat_forward_list_iterator_t<iffl::flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>,void>
            ((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
              *)&local_138,
             (flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              *)&last_range.super_range.buffer_end);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,&local_138,last_range.super_range.data_end - 1);
  if (!bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
  ::
  flat_forward_list_iterator_t<iffl::flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>,void>
            ((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
              *)&local_140,
             (flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              *)&last_range.super_range.buffer_end);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,&local_140,last_range.super_range.data_end);
  if (bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
  ::
  flat_forward_list_iterator_t<iffl::flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>,void>
            ((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
              *)&before_element1_start,
             (flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
              *)&last_range.super_range.buffer_end);
  bVar2 = iffl::
          flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          ::contains((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                      *)local_38,(const_iterator *)&before_element1_start,
                     last_range.super_range.data_end + 1);
  if (bVar2) {
    std::terminate();
  }
  iffl::range::begin((range *)&element2_it);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_before
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)&before_element1_end,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&before_element1_end,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element0_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_before
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)local_158,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)local_158,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element1_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::range_with_alighment<8UL>::buffer_end_aligned((range_with_alighment<8UL> *)&element2_it);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_before
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)&at_element1_start,(size_type)local_38);
  iffl::
  flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
  ::operator=((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
               *)local_158,&at_element1_start);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)local_158,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element1_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::range::begin((range *)&element2_it);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_at((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                     *)&at_element1_end,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&at_element1_end,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element1_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_at((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                     *)&after_element1_start,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&after_element1_start,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element2_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::range::begin((range *)&element2_it);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_after
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)&after_element1_end,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&after_element1_end,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element2_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_after
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)&before_element2_start,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&before_element2_start,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element3_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::range::begin((range *)&element3_it);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_before
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)&before_element2_end,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&before_element2_end,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element1_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_before
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)&at_element2_start,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&at_element2_start,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element2_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::range::begin((range *)&element3_it);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_at((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                     *)&at_element2_end,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&at_element2_end,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element2_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_at((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                     *)&after_element2_start,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&after_element2_start,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element3_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::range::begin((range *)&element3_it);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_after
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)&after_element2_end,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&after_element2_end,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element3_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_after
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)&before_last_start,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&before_last_start,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&element4_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::range::begin((range *)local_110);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_before
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)local_1b8,(size_type)local_38);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::cend((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          *)&before_last_end);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator!=((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)local_1b8,
                       (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&before_last_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_before
            ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)&at_last_start,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&at_last_start,
                       (flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&last_range.super_range.buffer_end);
  if (!bVar2) {
    std::terminate();
  }
  iffl::range::begin((range *)local_110);
  iffl::
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  ::find_element_at((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                     *)&at_last_end,(size_type)local_38);
  bVar2 = iffl::
          flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
          ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                        *)&at_last_end,
                       (flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                        *)&last_range.super_range.buffer_end);
  if (bVar2) {
    iffl::
    flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
    ::find_element_at((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                       *)local_1d8,(size_type)local_38);
    iffl::
    flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
    ::cend((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
            *)&after_last_start);
    bVar2 = iffl::
            flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
            ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                          *)local_1d8,
                         (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                          *)&after_last_start);
    if (!bVar2) {
      std::terminate();
    }
    iffl::range::begin((range *)local_110);
    iffl::
    flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
    ::find_element_after
              ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                *)local_1e8,(size_type)local_38);
    iffl::
    flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
    ::cend((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
            *)&after_last_end);
    bVar2 = iffl::
            flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
            ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                          *)local_1e8,
                         (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                          *)&after_last_end);
    if (bVar2) {
      iffl::
      flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
      ::find_element_after
                ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                  *)local_1f8,(size_type)local_38);
      iffl::
      flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
      ::cend((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *)local_200);
      bVar2 = iffl::
              flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
              ::operator==((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                            *)local_1f8,
                           (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                            *)local_200);
      if (bVar2) {
        iffl::
        flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
        ::~flat_forward_list
                  ((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
                    *)local_38);
        iffl::debug_memory_resource::~debug_memory_resource
                  ((debug_memory_resource *)&ffl.buffer_.v2_.end);
        return;
      }
      std::terminate();
    }
    std::terminate();
  }
  std::terminate();
}

Assistant:

void flat_forward_list_find_by_offset_test1() {
    iffl::debug_memory_resource dbg_memory_resource;
    iffl::pmr_flat_forward_list<FLAT_FORWARD_LIST_TEST> ffl{ &dbg_memory_resource };
    fill_container_with_data(ffl, 10);

    FFL_CODDING_ERROR_IF_NOT(10 <= ffl.size());

    auto const element0_it = ffl.cbegin();
    auto const element0_range = ffl.range(element0_it);
    FFL_CODDING_ERROR_IF(element0_range.begin() < 0 || element0_range.begin() >= element0_range.buffer_end);
    FFL_CODDING_ERROR_IF(true == ffl.contains(element0_it, element0_range.begin() - 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element0_it, element0_range.begin()));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element0_it, element0_range.begin() + 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element0_it, element0_range.buffer_end - 1));
    FFL_CODDING_ERROR_IF(true  == ffl.contains(element0_it, element0_range.buffer_end));
    FFL_CODDING_ERROR_IF(true == ffl.contains(element0_it, element0_range.buffer_end_aligned() + 1));

    auto const element1_it = element0_it + 1;
    auto const element1_range = ffl.range(element1_it);
    FFL_CODDING_ERROR_IF(element1_range.begin() < 0 || element1_range.begin() >= element1_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(element1_range.begin() == element0_range.buffer_end_aligned());
    FFL_CODDING_ERROR_IF(true == ffl.contains(element1_it, element1_range.begin() - 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element1_it, element1_range.begin()));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element1_it, element1_range.begin() + 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element1_it, element1_range.buffer_end - 1));
    FFL_CODDING_ERROR_IF(true == ffl.contains(element1_it, element1_range.buffer_end));
    FFL_CODDING_ERROR_IF(true == ffl.contains(element1_it, element1_range.buffer_end + 1));

    auto const element2_it = element1_it + 1;
    auto const element2_range = ffl.range(element2_it);
    FFL_CODDING_ERROR_IF(element2_range.begin() < 0 || element2_range.begin() >= element2_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(element2_range.begin() == element1_range.buffer_end_aligned());
    FFL_CODDING_ERROR_IF(true == ffl.contains(element2_it, element2_range.begin() - 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element2_it, element2_range.begin()));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element2_it, element2_range.begin() + 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element2_it, element2_range.buffer_end - 1));
    FFL_CODDING_ERROR_IF(true == ffl.contains(element2_it, element2_range.buffer_end));
    FFL_CODDING_ERROR_IF(true == ffl.contains(element2_it, element2_range.buffer_end + 1));

    auto const element3_it = element2_it + 1;
    auto const element3_range = ffl.range(element3_it);
    FFL_CODDING_ERROR_IF(element3_range.begin() < 0 || element3_range.begin() >= element3_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(element3_range.begin() == element2_range.buffer_end_aligned());
    FFL_CODDING_ERROR_IF(true == ffl.contains(element3_it, element3_range.begin() - 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element3_it, element3_range.begin()));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element3_it, element3_range.begin() + 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element3_it, element3_range.buffer_end - 1));
    FFL_CODDING_ERROR_IF(true == ffl.contains(element3_it, element3_range.buffer_end));
    FFL_CODDING_ERROR_IF(true == ffl.contains(element3_it, element3_range.buffer_end + 1));

    auto const element4_it = element3_it + 1;
    auto const element4_range = ffl.range(element4_it);
    FFL_CODDING_ERROR_IF(element4_range.begin() < 0 || element4_range.begin() >= element4_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(element4_range.begin() == element3_range.buffer_end_aligned());
    FFL_CODDING_ERROR_IF(true == ffl.contains(element4_it, element4_range.begin() - 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element4_it, element4_range.begin()));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element4_it, element4_range.begin() + 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(element4_it, element4_range.buffer_end - 1));
    FFL_CODDING_ERROR_IF(true == ffl.contains(element4_it, element4_range.buffer_end));
    FFL_CODDING_ERROR_IF(true == ffl.contains(element4_it, element4_range.buffer_end + 1));

    [[maybe_unused]] auto const last_it = ffl.last();
    auto const last_range = ffl.range(last_it);
    FFL_CODDING_ERROR_IF(last_range.begin() < 0 || last_range.begin() >= last_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(element4_range.begin() <= last_range.buffer_end);
    FFL_CODDING_ERROR_IF(true == ffl.contains(last_it, last_range.begin() - 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(last_it, last_range.begin()));
    FFL_CODDING_ERROR_IF(false == ffl.contains(last_it, last_range.begin() + 1));
    FFL_CODDING_ERROR_IF(false == ffl.contains(last_it, last_range.buffer_end - 1));
    FFL_CODDING_ERROR_IF(true == ffl.contains(last_it, last_range.buffer_end));
    FFL_CODDING_ERROR_IF(true == ffl.contains(last_it, last_range.buffer_end + 1));


    auto const before_element1_start = ffl.find_element_before(element1_range.begin());
    FFL_CODDING_ERROR_IF_NOT(before_element1_start == element0_it);
    auto before_element1_end = ffl.find_element_before(element1_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(before_element1_end == element1_it);
    before_element1_end = ffl.find_element_before(element1_range.buffer_end_aligned());
    FFL_CODDING_ERROR_IF_NOT(before_element1_end == element1_it);

    auto const at_element1_start = ffl.find_element_at(element1_range.begin());
    FFL_CODDING_ERROR_IF_NOT(at_element1_start == element1_it);
    auto const at_element1_end = ffl.find_element_at(element1_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(at_element1_end == element2_it);

    auto const after_element1_start = ffl.find_element_after(element1_range.begin());
    FFL_CODDING_ERROR_IF_NOT(after_element1_start == element2_it);
    auto const after_element1_end = ffl.find_element_after(element1_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(after_element1_end == element3_it);


    auto const before_element2_start = ffl.find_element_before(element2_range.begin());
    FFL_CODDING_ERROR_IF_NOT(before_element2_start == element1_it);
    auto const before_element2_end = ffl.find_element_before(element2_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(before_element2_end == element2_it);

    auto const at_element2_start = ffl.find_element_at(element2_range.begin());
    FFL_CODDING_ERROR_IF_NOT(at_element2_start == element2_it);
    auto const at_element2_end = ffl.find_element_at(element2_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(at_element2_end == element3_it);

    auto const after_element2_start = ffl.find_element_after(element2_range.begin());
    FFL_CODDING_ERROR_IF_NOT(after_element2_start == element3_it);
    auto const after_element2_end = ffl.find_element_after(element2_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(after_element2_end == element4_it);


    auto const before_last_start = ffl.find_element_before(last_range.begin());
    FFL_CODDING_ERROR_IF_NOT(before_last_start != ffl.cend());
    auto const before_last_end = ffl.find_element_before(last_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(before_last_end == last_it);

    auto const at_last_start = ffl.find_element_at(last_range.begin());
    FFL_CODDING_ERROR_IF_NOT(at_last_start == last_it);
    auto const at_last_end = ffl.find_element_at(last_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(at_last_end == ffl.cend());

    auto const after_last_start = ffl.find_element_after(last_range.begin());
    FFL_CODDING_ERROR_IF_NOT(after_last_start == ffl.cend());
    auto const after_last_end = ffl.find_element_after(last_range.buffer_end);
    FFL_CODDING_ERROR_IF_NOT(after_last_end == ffl.cend());
}